

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserProbModelXML.cpp
# Opt level: O0

void __thiscall ParserProbModelXML::ReadObservations(ParserProbModelXML *this)

{
  ostream *poVar1;
  ulong uVar2;
  undefined8 uVar3;
  size_type sVar4;
  reference pvVar5;
  ParserProbModelXML *this_00;
  xmlNodePtr node;
  xmlXPathObjectPtr pxVar6;
  key_type *__k;
  long in_RDI;
  pair<unsigned_int,__xmlNode_*> pVar7;
  pair<ParserProbModelXML::elm_type,_unsigned_int> element;
  string obs_name;
  int j;
  xmlNodeSetPtr obs_nodeset;
  xmlXPathObjectPtr obs_nodes;
  string comment;
  stringstream obs_path_ss;
  string parent_name;
  xmlNodePtr parent_node;
  xmlNodeSetPtr link_nodeset;
  xmlXPathObjectPtr link_nodes;
  stringstream link_path_ss;
  Index aI_1;
  size_t i_1;
  string agent_name;
  xmlXPathObjectPtr agent_node;
  Index aI;
  int i;
  vector<std::pair<unsigned_int,__xmlNode_*>,_std::allocator<std::pair<unsigned_int,__xmlNode_*>_>_>
  parsed_actions;
  xmlNodeSetPtr action_nodeset;
  xmlXPathObjectPtr action_nodes;
  xmlChar *xpath;
  string *in_stack_fffffffffffffa98;
  MultiAgentDecisionProcessDiscreteFactoredStates *in_stack_fffffffffffffaa0;
  pair<ParserProbModelXML::elm_type,_unsigned_int> in_stack_fffffffffffffaa8;
  MultiAgentDecisionProcessDiscreteFactoredStates *in_stack_fffffffffffffab0;
  __normal_iterator<std::pair<unsigned_int,__xmlNode_*>_*,_std::vector<std::pair<unsigned_int,__xmlNode_*>,_std::allocator<std::pair<unsigned_int,__xmlNode_*>_>_>_>
  in_stack_fffffffffffffab8;
  __normal_iterator<std::pair<unsigned_int,__xmlNode_*>_*,_std::vector<std::pair<unsigned_int,__xmlNode_*>,_std::allocator<std::pair<unsigned_int,__xmlNode_*>_>_>_>
  in_stack_fffffffffffffac0;
  ostream *in_stack_fffffffffffffae0;
  xmlNodePtr in_stack_fffffffffffffb10;
  xmlNodePtr node_00;
  ParserProbModelXML *in_stack_fffffffffffffb18;
  string local_4b8 [36];
  undefined4 local_494;
  pair<ParserProbModelXML::elm_type,_unsigned_int> local_490;
  string local_488 [36];
  int local_464;
  xmlNodeSetPtr local_460;
  string local_458 [32];
  MultiAgentDecisionProcessDiscreteFactoredStates *local_438;
  string local_430 [32];
  stringstream local_410 [16];
  ostream local_400 [192];
  string *in_stack_fffffffffffffcc0;
  MultiAgentDecisionProcess *in_stack_fffffffffffffcc8;
  string local_288 [32];
  key_type *local_268;
  xmlNodeSetPtr local_260;
  string local_258 [32];
  xmlXPathObjectPtr local_238;
  stringstream local_230 [16];
  ostream local_220 [380];
  uint local_a4;
  ulong local_a0;
  pair<unsigned_int,__xmlNode_*> *local_98;
  pair<unsigned_int,__xmlNode_*> *local_90;
  uint local_88;
  ParserProbModelXML *local_80;
  string local_78 [32];
  xmlXPathObjectPtr local_58;
  Index local_40;
  Index local_3c;
  _xmlNode *local_20;
  _xmlNode *local_18;
  char *local_10;
  
  local_10 = "/ProbModelXML/ProbNet/Variables/Variable[@timeSlice=\'1\' and @role=\'decision\']";
  local_18 = (_xmlNode *)
             GetNodesMatchingExpression
                       ((ParserProbModelXML *)in_stack_fffffffffffffab8._M_current,
                        (xmlChar *)in_stack_fffffffffffffab0,(xmlNodePtr)in_stack_fffffffffffffaa8);
  if (local_18 == (_xmlNode *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "Warning: No action nodes for the second timeslice were found in the target file. There are no observations in the model."
                            );
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  else {
    local_20 = *(_xmlNode **)&local_18->type;
    std::
    vector<std::pair<unsigned_int,__xmlNode_*>,_std::allocator<std::pair<unsigned_int,__xmlNode_*>_>_>
    ::vector((vector<std::pair<unsigned_int,__xmlNode_*>,_std::allocator<std::pair<unsigned_int,__xmlNode_*>_>_>
              *)0xa83daa);
    for (local_3c = 0; (int)local_3c < *(int *)&local_20->_private; local_3c = local_3c + 1) {
      if ((*(byte *)(in_RDI + 0x78) & 1) == 0) {
LAB_00a83f8d:
        local_40 = local_3c;
      }
      else {
        uVar2 = (**(code **)(**(long **)(in_RDI + 0x80) + 0x10))();
        if (uVar2 < 2) goto LAB_00a83f8d;
        local_58 = GetNodesMatchingExpression
                             ((ParserProbModelXML *)in_stack_fffffffffffffab8._M_current,
                              (xmlChar *)in_stack_fffffffffffffab0,
                              (xmlNodePtr)in_stack_fffffffffffffaa8);
        if (local_58 == (xmlXPathObjectPtr)0x0) {
          uVar3 = __cxa_allocate_exception(0x28);
          EParse::EParse((EParse *)in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98);
          __cxa_throw(uVar3,&EParse::typeinfo,EParse::~EParse);
        }
        GetVariableName_abi_cxx11_(in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
        local_40 = MultiAgentDecisionProcess::GetAgentIndexByName
                             (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
        xmlXPathFreeObject(local_58);
        std::__cxx11::string::~string(local_78);
      }
      pVar7 = std::make_pair<unsigned_int&,_xmlNode*&>
                        ((uint *)in_stack_fffffffffffffaa0,(_xmlNode **)in_stack_fffffffffffffa98);
      in_stack_fffffffffffffb18 = (ParserProbModelXML *)pVar7.second;
      local_88 = pVar7.first;
      local_80 = in_stack_fffffffffffffb18;
      std::
      vector<std::pair<unsigned_int,__xmlNode_*>,_std::allocator<std::pair<unsigned_int,__xmlNode_*>_>_>
      ::push_back((vector<std::pair<unsigned_int,__xmlNode_*>,_std::allocator<std::pair<unsigned_int,__xmlNode_*>_>_>
                   *)in_stack_fffffffffffffaa0,(value_type *)in_stack_fffffffffffffa98);
    }
    node_00 = (xmlNodePtr)&stack0xffffffffffffffc8;
    local_90 = (pair<unsigned_int,__xmlNode_*> *)
               std::
               vector<std::pair<unsigned_int,__xmlNode_*>,_std::allocator<std::pair<unsigned_int,__xmlNode_*>_>_>
               ::begin((vector<std::pair<unsigned_int,__xmlNode_*>,_std::allocator<std::pair<unsigned_int,__xmlNode_*>_>_>
                        *)in_stack_fffffffffffffa98);
    local_98 = (pair<unsigned_int,__xmlNode_*> *)
               std::
               vector<std::pair<unsigned_int,__xmlNode_*>,_std::allocator<std::pair<unsigned_int,__xmlNode_*>_>_>
               ::end((vector<std::pair<unsigned_int,__xmlNode_*>,_std::allocator<std::pair<unsigned_int,__xmlNode_*>_>_>
                      *)in_stack_fffffffffffffa98);
    std::
    sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,_xmlNode*>*,std::vector<std::pair<unsigned_int,_xmlNode*>,std::allocator<std::pair<unsigned_int,_xmlNode*>>>>,bool(*)(std::pair<unsigned_int,_xmlNode*>,std::pair<unsigned_int,_xmlNode*>)>
              (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
               (_func_bool_pair<unsigned_int,__xmlNode_ptr>_pair<unsigned_int,__xmlNode_ptr> *)
               in_stack_fffffffffffffab0);
    local_a0 = 0;
    while( true ) {
      uVar2 = local_a0;
      sVar4 = std::
              vector<std::pair<unsigned_int,__xmlNode_*>,_std::allocator<std::pair<unsigned_int,__xmlNode_*>_>_>
              ::size((vector<std::pair<unsigned_int,__xmlNode_*>,_std::allocator<std::pair<unsigned_int,__xmlNode_*>_>_>
                      *)&stack0xffffffffffffffc8);
      if (sVar4 <= uVar2) break;
      if ((*(byte *)(in_RDI + 0x88) & 1) == 0) {
        pvVar5 = std::
                 vector<std::pair<unsigned_int,__xmlNode_*>,_std::allocator<std::pair<unsigned_int,__xmlNode_*>_>_>
                 ::operator[]((vector<std::pair<unsigned_int,__xmlNode_*>,_std::allocator<std::pair<unsigned_int,__xmlNode_*>_>_>
                               *)&stack0xffffffffffffffc8,local_a0);
        local_a4 = pvVar5->first;
      }
      else {
        local_a4 = 0;
      }
      std::__cxx11::stringstream::stringstream(local_230);
      poVar1 = std::operator<<(local_220,
                               "/ProbModelXML/ProbNet/Links/Link/Variable[starts-with(@name, \"");
      pvVar5 = std::
               vector<std::pair<unsigned_int,__xmlNode_*>,_std::allocator<std::pair<unsigned_int,__xmlNode_*>_>_>
               ::operator[]((vector<std::pair<unsigned_int,__xmlNode_*>,_std::allocator<std::pair<unsigned_int,__xmlNode_*>_>_>
                             *)&stack0xffffffffffffffc8,local_a0);
      this_00 = (ParserProbModelXML *)xmlGetProp(pvVar5->second,"name");
      node = (xmlNodePtr)std::operator<<(poVar1,(char *)this_00);
      std::operator<<((ostream *)node,"\") and @timeSlice=\'1\']");
      std::__cxx11::stringstream::str();
      std::__cxx11::string::c_str();
      pxVar6 = GetNodesMatchingExpression
                         ((ParserProbModelXML *)in_stack_fffffffffffffab8._M_current,
                          (xmlChar *)in_stack_fffffffffffffab0,(xmlNodePtr)in_stack_fffffffffffffaa8
                         );
      std::__cxx11::string::~string(local_258);
      local_238 = pxVar6;
      if (pxVar6 != (xmlXPathObjectPtr)0x0) {
        local_260 = pxVar6->nodesetval;
        if (1 < local_260->nodeNr) {
          in_stack_fffffffffffffae0 =
               std::operator<<((ostream *)&std::cout,
                               "Warning: multiple obervation factors for one agent are not yet supported."
                              );
          std::ostream::operator<<(in_stack_fffffffffffffae0,std::endl<char,std::char_traits<char>>)
          ;
        }
        __k = (key_type *)xmlFirstElementChild((*local_260->nodeTab)->parent);
        local_268 = __k;
        GetVariableName_abi_cxx11_(in_stack_fffffffffffffb18,node_00);
        std::__cxx11::stringstream::stringstream(local_410);
        poVar1 = std::operator<<(local_400,"/ProbModelXML/ProbNet/Variables/Variable[(@name=\'");
        poVar1 = std::operator<<(poVar1,local_288);
        poVar1 = std::operator<<(poVar1,"\' or @name=\'");
        in_stack_fffffffffffffab8._M_current =
             (pair<unsigned_int,__xmlNode_*> *)std::operator<<(poVar1,local_288);
        std::operator<<((ostream *)in_stack_fffffffffffffab8._M_current,
                        " [1]\') and @timeSlice=\'1\' and @role=\'chance\']");
        GetVariableComment_abi_cxx11_(this_00,node);
        std::operator<<(local_400,"/States/State");
        std::__cxx11::stringstream::str();
        std::__cxx11::string::c_str();
        in_stack_fffffffffffffab0 =
             (MultiAgentDecisionProcessDiscreteFactoredStates *)
             GetNodesMatchingExpression
                       ((ParserProbModelXML *)in_stack_fffffffffffffab8._M_current,
                        (xmlChar *)in_stack_fffffffffffffab0,(xmlNodePtr)in_stack_fffffffffffffaa8);
        std::__cxx11::string::~string(local_458);
        local_438 = in_stack_fffffffffffffab0;
        if (in_stack_fffffffffffffab0 != (MultiAgentDecisionProcessDiscreteFactoredStates *)0x0) {
          local_460 = (xmlNodeSetPtr)
                      (in_stack_fffffffffffffab0->super_MultiAgentDecisionProcess)._m_name.
                      _vptr_NamedDescribedEntity;
          for (local_464 = 0; local_464 < local_460->nodeNr; local_464 = local_464 + 1) {
            GetVariableName_abi_cxx11_(in_stack_fffffffffffffb18,node_00);
            MultiAgentDecisionProcessDiscreteFactoredStates::AddObservation
                      (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8.second,
                       (string *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
            local_494 = 2;
            in_stack_fffffffffffffaa8 =
                 std::make_pair<ParserProbModelXML::elm_type,unsigned_int&>
                           ((elm_type *)in_stack_fffffffffffffa98,(uint *)0xa84472);
            in_stack_fffffffffffffaa0 =
                 (MultiAgentDecisionProcessDiscreteFactoredStates *)(in_RDI + 0x18);
            local_490 = in_stack_fffffffffffffaa8;
            GetVariableName_abi_cxx11_(in_stack_fffffffffffffb18,node_00);
            in_stack_fffffffffffffa98 =
                 (string *)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParserProbModelXML::elm_type,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParserProbModelXML::elm_type,_unsigned_int>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParserProbModelXML::elm_type,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParserProbModelXML::elm_type,_unsigned_int>_>_>_>
                               *)in_stack_fffffffffffffae0,__k);
            std::pair<ParserProbModelXML::elm_type,_unsigned_int>::operator=
                      ((pair<ParserProbModelXML::elm_type,_unsigned_int> *)in_stack_fffffffffffffa98
                       ,&local_490);
            std::__cxx11::string::~string(local_4b8);
            std::__cxx11::string::~string(local_488);
          }
          xmlXPathFreeObject(local_438);
        }
        xmlXPathFreeObject(local_238);
        std::__cxx11::string::~string(local_430);
        std::__cxx11::stringstream::~stringstream(local_410);
        std::__cxx11::string::~string(local_288);
      }
      std::__cxx11::stringstream::~stringstream(local_230);
      local_a0 = local_a0 + 1;
    }
    xmlXPathFreeObject(local_18);
    MultiAgentDecisionProcessDiscreteFactoredStates::SetObservationsInitialized
              (in_stack_fffffffffffffaa0,SUB81((ulong)in_stack_fffffffffffffa98 >> 0x38,0));
    std::
    vector<std::pair<unsigned_int,__xmlNode_*>,_std::allocator<std::pair<unsigned_int,__xmlNode_*>_>_>
    ::~vector((vector<std::pair<unsigned_int,__xmlNode_*>,_std::allocator<std::pair<unsigned_int,__xmlNode_*>_>_>
               *)in_stack_fffffffffffffab0);
  }
  return;
}

Assistant:

void ParserProbModelXML::ReadObservations()
{
    if(DEBUG_PARSE)
    {
        cout << " --- Now Parsing Observations ---" << endl;
    }
    xmlChar *xpath = (xmlChar*) "/ProbModelXML/ProbNet/Variables/Variable[@timeSlice='1' and @role='decision']";
    xmlXPathObjectPtr action_nodes = GetNodesMatchingExpression(xpath);

    if (action_nodes == NULL){
        cout  << "Warning: No action nodes for the second timeslice were found in the target file. There are no observations in the model." << endl;
        return;
    }

    xmlNodeSetPtr action_nodeset = action_nodes->nodesetval;
    vector<pair<Index, xmlNodePtr> > parsed_actions;
    for (int i = 0; i < action_nodeset->nodeNr; i++)
    {
        Index aI;
        if(_m_agentsInitialized && _m_fDecPOMDP->GetNrAgents() > 1)
        {
            xmlXPathObjectPtr agent_node = GetNodesMatchingExpression((xmlChar*) "Agent",action_nodeset->nodeTab[i]);
            if(agent_node == NULL)
                throw EParse("Found an action node with no associated agent.");
            
            string agent_name = GetVariableName(agent_node->nodesetval->nodeTab[0]);
            aI = _m_fDecPOMDP->GetAgentIndexByName(agent_name);
            xmlXPathFreeObject (agent_node);
        }
        else
        {
            aI = i;
        }
        parsed_actions.push_back(make_pair(aI, action_nodeset->nodeTab[i]));
    }

    //Observations have to be loaded in agent-wise order
    sort(parsed_actions.begin(), parsed_actions.end(), CompareParsedActions);

    for (size_t i = 0; i < parsed_actions.size(); i++)
    {
        Index aI;
        if(_m_asynchronousModel)
            aI = 0; //asynchronous models are assumed to be centralized, for now.
        else
            aI = parsed_actions[i].first;
        //retrieving the nodes which link to each decision node for T+1
        stringstream link_path_ss;
        link_path_ss << "/ProbModelXML/ProbNet/Links/Link/Variable[starts-with(@name, \""
                     << (char*) xmlGetProp(parsed_actions[i].second, (xmlChar*) "name")
                     << "\") and @timeSlice='1']";
        xmlXPathObjectPtr link_nodes = GetNodesMatchingExpression((xmlChar*) link_path_ss.str().c_str());

        if(link_nodes != NULL)
        {
            xmlNodeSetPtr link_nodeset = link_nodes->nodesetval;
            if(link_nodeset->nodeNr > 1){
                cout << "Warning: multiple obervation factors for one agent are not yet supported." << endl;
            }
            //For now, it is assumed that the observation model is factored agent-wise - that is, there is no more than one 
            //chance node linked to each decision node in slice T+1. If support for this feature is needed, it should be added here.
            //Each link_nodeset->nodeTab element should represent one of the observation factors of agent i.
            xmlNodePtr parent_node = xmlFirstElementChild(link_nodeset->nodeTab[0]->parent);
            string parent_name =  GetVariableName(parent_node);
            //now we must retrieve the original chance nodes with this name and parse them.
            stringstream obs_path_ss;
            obs_path_ss << "/ProbModelXML/ProbNet/Variables/Variable[(@name='"
                        << parent_name << "' or @name='" << parent_name << " [1]') and @timeSlice='1' and @role='chance']";
            string comment = GetVariableComment(parent_node);
            obs_path_ss << "/States/State";
            xmlXPathObjectPtr obs_nodes = GetNodesMatchingExpression((xmlChar*) obs_path_ss.str().c_str());
            if(obs_nodes != NULL)
            {        
                xmlNodeSetPtr obs_nodeset = obs_nodes->nodesetval;
                for(int j = 0; j < obs_nodeset->nodeNr; j++)
                {
                    string obs_name = GetVariableName(obs_nodeset->nodeTab[j]);
                    _m_fDecPOMDP->AddObservation(aI, obs_name, comment);
                    pair<elm_type, Index> element = make_pair(OBSERVATION, aI);
                    _m_parsedElements[GetVariableName(parent_node)] = element;
                    if(DEBUG_PARSE)
                    {
                        cout << "Added observation: " << obs_name << " to agent " << aI << endl;
                    }
                }
                xmlXPathFreeObject (obs_nodes);
            }
            xmlXPathFreeObject (link_nodes);
        }
    }
    xmlXPathFreeObject (action_nodes);

    _m_fDecPOMDP->SetObservationsInitialized(true);

    return;
}